

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_stateless_kernel_1.h
# Opt level: O2

void __thiscall
dlib::memory_manager_stateless_kernel_1<dlib::thread_pool_implementation::task_state_type>::
deallocate_array(memory_manager_stateless_kernel_1<dlib::thread_pool_implementation::task_state_type>
                 *this,task_state_type *item)

{
  long lVar1;
  long lVar2;
  
  if (item != (task_state_type *)0x0) {
    lVar1 = *(long *)&item[-1].field_0x198;
    if (lVar1 != 0) {
      lVar2 = lVar1 * 0x1a0;
      do {
        thread_pool_implementation::task_state_type::~task_state_type
                  ((task_state_type *)(&item[-1].is_being_processed + lVar2));
        lVar2 = lVar2 + -0x1a0;
      } while (lVar2 != 0);
    }
    operator_delete__(&item[-1].eptr,lVar1 * 0x1a0 | 0x10);
    return;
  }
  return;
}

Assistant:

void deallocate_array (
                T* item
            ) 
            { 
                delete [] item;
            }